

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

span<int,_3UL> __thiscall
nonstd::span_lite::span<int,18446744073709551615ul>::last<3ul>
          (span<int,18446744073709551615ul> *this)

{
  span<int,_3UL> sVar1;
  logic_error *this_00;
  span<int,_3UL> local_20;
  
  if (2 < *(ulong *)(this + 8)) {
    span<int,_3UL>::span<int_*,_0>
              (&local_20,(int *)(*(long *)this + *(ulong *)(this + 8) * 4 + -0xc),3);
    sVar1.size_ = local_20.size_;
    sVar1.data_ = local_20.data_;
    return sVar1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            ((logic_error *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1165: Precondition violation."
            );
  local_20.data_ = (pointer)&PTR__logic_error_001e9b38;
  std::logic_error::logic_error(this_00,(logic_error *)&local_20);
  *(undefined ***)this_00 = &PTR__logic_error_001e9b38;
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_constexpr size_type size() const span_noexcept
    {
        return size_;
    }